

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackNSISGenerator.cxx
# Opt level: O0

int __thiscall cmCPackNSISGenerator::PackageFiles(cmCPackNSISGenerator *this)

{
  OutputOption outputflag;
  cmCPackLog *pcVar1;
  cmCPackInstallationType *pcVar2;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> alt;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> alt_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar3;
  ulong uVar4;
  string *psVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  ostream *poVar6;
  char *pcVar7;
  reference remote;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  mapped_type *pmVar8;
  size_type __n;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>_>_>
  *this_01;
  reference ppVar9;
  reference ppcVar10;
  reference ppcVar11;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
  *this_02;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
  *this_03;
  basic_string_view<char,_std::char_traits<char>_> bVar12;
  string_view sVar13;
  byte local_3061;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2fd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2eb8;
  bool local_2c7a;
  string local_2b40 [32];
  undefined1 local_2b20 [8];
  ostringstream cmCPackLog_msg_7;
  undefined1 local_29a8 [8];
  cmGeneratedFileStream ofs;
  int local_2734;
  undefined1 local_2730 [3];
  bool res;
  int retVal;
  string output;
  undefined1 local_26f0 [8];
  ostringstream cmCPackLog_msg_6;
  string local_2578;
  char local_2552;
  allocator<char> local_2551;
  string local_2550;
  cmValue local_2530;
  char local_2521;
  undefined1 local_2520 [8];
  string nsisCmd;
  string local_24f8;
  allocator<char> local_24d1;
  string local_24d0;
  allocator<char> local_24a9;
  string local_24a8;
  allocator<char> local_2481;
  string local_2480;
  allocator<char> local_2459;
  string local_2458;
  allocator<char> local_2431;
  string local_2430;
  allocator<char> local_2409;
  string local_2408;
  allocator<char> local_23e1;
  string local_23e0;
  cmValue local_23c0;
  allocator<char> local_23b1;
  string local_23b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2350;
  allocator<char> local_2329;
  string local_2328;
  string local_2308 [32];
  string local_22e8;
  string local_22c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_22a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21c8;
  string local_21a8;
  reference local_2188;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>
  *comp;
  iterator __end2_5;
  iterator __begin2_5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
  *__range2_5;
  string local_2148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20c8;
  string local_20a8;
  reference local_2088;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>
  *group;
  iterator __end2_4;
  iterator __begin2_4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
  *__range2_4;
  cmCPackInstallationType *installType_1;
  iterator __end2_3;
  iterator __begin2_3;
  vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_> *__range2_3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>
  *installType;
  iterator __end2_2;
  iterator __begin2_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>_>_>
  *__range2_2;
  undefined1 local_2020 [8];
  vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_> installTypes;
  undefined1 local_2000 [7];
  bool anyDownloadedComponents;
  ostringstream macrosOut;
  undefined1 local_1e88 [8];
  string defines;
  string installTypesCode;
  string groupDescriptions;
  string componentDescriptions;
  string selectedVarsList;
  string sectionList;
  string componentCode;
  string local_1da0;
  allocator<char> local_1d79;
  string local_1d78;
  allocator<char> local_1d51;
  string local_1d50;
  allocator<char> local_1d29;
  string local_1d28;
  allocator<char> local_1d01;
  string local_1d00;
  allocator<char> local_1cd9;
  string local_1cd8;
  allocator<char> local_1cb1;
  string local_1cb0;
  char local_1c89;
  string local_1c88;
  string local_1c68;
  string_view local_1c48;
  string_view local_1c38;
  reference local_1c28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_1;
  iterator __end2_1;
  iterator __begin2_1;
  cmList *__range2_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c00;
  iterator local_1be0;
  size_type local_1bd8;
  undefined1 local_1bd0 [8];
  cmList expandedArguments_1;
  string local_1bb0;
  cmValue local_1b90;
  cmValue nsisArguments_1;
  string nsisPostArguments;
  string local_1b60;
  string local_1b40;
  string_view local_1b20;
  string_view local_1b10;
  reference local_1b00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  iterator __end2;
  iterator __begin2;
  cmList *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ad8;
  iterator local_1ab8;
  size_type local_1ab0;
  undefined1 local_1aa8 [8];
  cmList expandedArguments;
  string local_1a88;
  cmValue local_1a68;
  cmValue nsisArguments;
  string nsisPreArguments;
  string local_1a38;
  allocator<char> local_1a11;
  string local_1a10;
  cmValue local_19f0;
  undefined1 local_19e8 [8];
  string licenceCode;
  string local_19c0;
  allocator<char> local_1999;
  string local_1998;
  allocator<char> local_1971;
  string local_1970;
  cmValue local_1950;
  undefined1 local_1948 [8];
  string brandingTextCode;
  undefined1 local_1908 [8];
  ostringstream cmCPackLog_msg_5;
  _Self local_1790;
  _Self local_1788;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_177e;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_177d;
  undefined1 local_177c;
  allocator<char> local_177b;
  allocator<char> local_177a;
  allocator<char> local_1779;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1770;
  string local_1750 [32];
  string local_1730 [32];
  iterator local_1710;
  size_type local_1708;
  undefined1 local_1700 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  possiblePositions;
  string local_16c8;
  cmValue local_16a8;
  undefined1 local_16a0 [8];
  string wantedPosition;
  string local_1678;
  allocator<char> local_1651;
  undefined1 local_1650 [8];
  string brandingTextPosition;
  string local_1628;
  allocator<char> local_1601;
  string local_1600;
  allocator<char> local_15d9;
  string local_15d8;
  allocator<char> local_15b1;
  string local_15b0;
  allocator<char> local_1589;
  string local_1588;
  allocator<char> local_1561;
  string local_1560;
  allocator<char> local_1539;
  string local_1538;
  cmValue local_1518;
  undefined1 local_1510 [8];
  string finishTitleCode;
  string local_14e8;
  allocator<char> local_14c1;
  string local_14c0;
  allocator<char> local_1499;
  string local_1498;
  allocator<char> local_1471;
  string local_1470;
  allocator<char> local_1449;
  string local_1448;
  cmValue local_1428;
  undefined1 local_1420 [8];
  string welcomeTitleCode;
  string local_13f8;
  allocator<char> local_13d1;
  string local_13d0;
  allocator<char> local_13a9;
  string local_13a8;
  cmValue local_1388;
  char local_137a;
  allocator<char> local_1379;
  string local_1378;
  cmValue local_1358;
  undefined1 local_1350 [8];
  string installerRunCode;
  string local_1328;
  allocator<char> local_1301;
  string local_1300;
  allocator<char> local_12d9;
  string local_12d8;
  cmValue local_12b8;
  undefined1 local_12b0 [8];
  string installerBitmapCode_1;
  string local_1288;
  allocator<char> local_1261;
  string local_1260;
  allocator<char> local_1239;
  string local_1238;
  cmValue local_1218;
  undefined1 local_1210 [8];
  string installerBitmapCode;
  string local_11e8;
  allocator<char> local_11c1;
  string local_11c0;
  undefined1 local_11a0 [8];
  string installerIconCode_1;
  string local_1178;
  cmValue local_1158;
  allocator<char> local_1149;
  string local_1148;
  allocator<char> local_1121;
  string local_1120;
  cmValue local_1100;
  allocator<char> local_10f1;
  string local_10f0;
  undefined1 local_10d0 [8];
  string installerHeaderImage;
  string local_10a8;
  allocator<char> local_1081;
  string local_1080;
  cmValue local_1060;
  string local_1058;
  allocator<char> local_1031;
  string local_1030;
  allocator<char> local_1009;
  string local_1008;
  cmValue local_fe8;
  string local_fe0;
  allocator<char> local_fb9;
  string local_fb8;
  string local_f98 [8];
  string installerIconCode;
  string local_f70;
  allocator<char> local_f49;
  string local_f48;
  string local_f28 [32];
  undefined1 local_f08 [8];
  ostringstream cmCPackLog_msg_4;
  string local_d90;
  allocator<char> local_d69;
  string local_d68;
  string local_d48 [32];
  string local_d28 [32];
  undefined1 local_d08 [8];
  ostringstream cmCPackLog_msg_3;
  undefined1 local_b80 [8];
  string componentOutputDir;
  string local_b48 [32];
  long local_b28;
  size_type slash;
  string fileN_1;
  string componentName_1;
  string *dir;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  ostringstream dstr;
  undefined1 local_948 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  allocator<char> local_909;
  string local_908;
  string local_8e8 [32];
  string local_8c8 [32];
  undefined1 local_8a8 [8];
  ostringstream cmCPackLog_msg_2;
  char local_72a [2];
  char *local_728;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_720;
  string local_718 [32];
  string_view local_6f8;
  string local_6e8;
  basic_string_view<char,_std::char_traits<char>_> local_6c8;
  string local_6b8;
  basic_string_view<char,_std::char_traits<char>_> local_698;
  size_t sStack_688;
  basic_string_view<char,_std::char_traits<char>_> componentName;
  size_type pos;
  string fileN;
  string local_648 [8];
  string outputDir;
  string *file;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  ostringstream str;
  undefined1 local_490 [8];
  string nsisInstallOptions;
  string tmpFile;
  string local_448;
  cmValue local_428;
  undefined1 local_420 [8];
  string nsisFileName;
  undefined1 local_3e0 [8];
  ostringstream cmCPackLog_msg_1;
  _Storage<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_260;
  undefined8 local_250;
  string_view local_248;
  undefined1 local_238 [8];
  string nsisInInstallOptions;
  string local_210 [48];
  undefined1 local_1e0 [8];
  ostringstream cmCPackLog_msg;
  _Storage<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_60;
  undefined8 local_50;
  string_view local_48;
  undefined1 local_38 [8];
  string nsisInFileName;
  cmCPackNSISGenerator *this_local;
  
  nsisInFileName.field_2._8_8_ = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_48,"NSIS.template.in");
  std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::optional
            ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_60);
  alt.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_str = local_60._M_value._M_str;
  alt.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_len = local_60._M_value._M_len;
  alt.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _16_8_ = local_50;
  cmCPackGenerator::FindTemplate_abi_cxx11_
            ((string *)local_38,&this->super_cmCPackGenerator,local_48,alt);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
    poVar6 = std::operator<<((ostream *)local_1e0,
                             "CPack error: Could not find NSIS installer template file.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x31,pcVar7);
    std::__cxx11::string::~string(local_210);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
    this_local._4_4_ = 0;
    nsisInInstallOptions.field_2._12_4_ = 1;
    goto LAB_001ec749;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_248,"NSIS.InstallOptions.ini.in");
  std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::optional
            ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_260);
  alt_00.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_str = local_260._M_value._M_str;
  alt_00.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_len = local_260._M_value._M_len;
  alt_00.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _16_8_ = local_250;
  cmCPackGenerator::FindTemplate_abi_cxx11_
            ((string *)local_238,&this->super_cmCPackGenerator,local_248,alt_00);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_448,"CPACK_TOPLEVEL_DIRECTORY",
               (allocator<char> *)(tmpFile.field_2._M_local_buf + 0xf));
    local_428 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_448);
    psVar5 = cmValue::operator_cast_to_string_(&local_428);
    std::__cxx11::string::string((string *)local_420,(string *)psVar5);
    std::__cxx11::string::~string((string *)&local_448);
    std::allocator<char>::~allocator((allocator<char> *)(tmpFile.field_2._M_local_buf + 0xf));
    cmStrCat<std::__cxx11::string&,char_const(&)[16]>
              ((string *)((long)&nsisInstallOptions.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_420,
               (char (*) [16])"/NSISOutput.log");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_490,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_420,
                   "/NSIS.InstallOptions.ini");
    std::__cxx11::string::operator+=((string *)local_420,"/project.nsi");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range1);
    this_00 = &(this->super_cmCPackGenerator).files;
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_00);
    file = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this_00);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&file);
      if (!bVar3) break;
      outputDir.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_648,"$INSTDIR",(allocator<char> *)(fileN.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(fileN.field_2._M_local_buf + 0xf));
      cmSystemTools::RelativePath
                ((string *)&pos,&(this->super_cmCPackGenerator).toplevel,
                 (string *)outputDir.field_2._8_8_);
      bVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
              ::empty(&(this->super_cmCPackGenerator).Components);
      if (!bVar3) {
        componentName._M_str = (char *)std::__cxx11::string::find((char)&pos,0x2f);
        if (componentName._M_str == (char *)0xffffffffffffffff) {
          sVar13 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&pos);
          local_6f8 = sVar13;
          CustomComponentInstallDirectory_abi_cxx11_(&local_6e8,this,sVar13);
          std::__cxx11::string::operator=(local_648,(string *)&local_6e8);
          std::__cxx11::string::~string((string *)&local_6e8);
        }
        else {
          bVar12 = (basic_string_view<char,_std::char_traits<char>_>)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&pos);
          local_698 = bVar12;
          bVar12 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                             (&local_698,0,(size_type)componentName._M_str);
          componentName._M_len = (size_t)bVar12._M_str;
          sStack_688 = bVar12._M_len;
          local_6c8 = bVar12;
          CustomComponentInstallDirectory_abi_cxx11_(&local_6b8,this,bVar12);
          std::__cxx11::string::operator=(local_648,(string *)&local_6b8);
          std::__cxx11::string::~string((string *)&local_6b8);
        }
        std::__cxx11::string::substr((ulong)local_718,(ulong)&pos);
        std::__cxx11::string::operator=((string *)&pos,local_718);
        std::__cxx11::string::~string(local_718);
      }
      local_720._M_current = (char *)std::__cxx11::string::begin();
      local_728 = (char *)std::__cxx11::string::end();
      local_72a[1] = 0x2f;
      local_72a[0] = '\\';
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (local_720,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )local_728,local_72a + 1,local_72a);
      poVar6 = std::operator<<((ostream *)&__range1,"  Delete \"");
      poVar6 = std::operator<<(poVar6,local_648);
      poVar6 = std::operator<<(poVar6,"\\");
      poVar6 = std::operator<<(poVar6,(string *)&pos);
      poVar6 = std::operator<<(poVar6,"\"");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&pos);
      std::__cxx11::string::~string(local_648);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8a8);
    poVar6 = std::operator<<((ostream *)local_8a8,"Uninstall Files: ");
    std::__cxx11::ostringstream::str();
    poVar6 = std::operator<<(poVar6,local_8c8);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_8c8);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x58,pcVar7);
    std::__cxx11::string::~string(local_8e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_908,"CPACK_NSIS_DELETE_FILES",&local_909);
    std::__cxx11::ostringstream::str();
    cmCPackGenerator::SetOptionIfNotSet
              (&this->super_cmCPackGenerator,&local_908,
               (string *)
               &dirs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &dirs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_908);
    std::allocator<char>::~allocator(&local_909);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_948);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    GetListOfSubdirectories
              (this,pcVar7,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_948);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range1_1);
    __end1_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_948);
    dir = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_948);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end1_1,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&dir);
      if (!bVar3) break;
      remote = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1_1);
      std::__cxx11::string::string((string *)(fileN_1.field_2._M_local_buf + 8));
      cmSystemTools::RelativePath((string *)&slash,&(this->super_cmCPackGenerator).toplevel,remote);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        bVar3 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                ::empty(&(this->super_cmCPackGenerator).Components);
        if (!bVar3) {
          local_b28 = std::__cxx11::string::find((char)&slash,0x2f);
          if (local_b28 != -1) {
            std::__cxx11::string::substr((ulong)local_b48,(ulong)&slash);
            std::__cxx11::string::operator=((string *)(fileN_1.field_2._M_local_buf + 8),local_b48);
            std::__cxx11::string::~string(local_b48);
            std::__cxx11::string::erase((ulong)&slash,0);
          }
        }
        __first._M_current = (char *)std::__cxx11::string::begin();
        __last._M_current = (char *)std::__cxx11::string::end();
        componentOutputDir.field_2._M_local_buf[0xf] = '/';
        componentOutputDir.field_2._M_local_buf[0xe] = '\\';
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  (__first,__last,componentOutputDir.field_2._M_local_buf + 0xf,
                   componentOutputDir.field_2._M_local_buf + 0xe);
        sVar13 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view
                           ((string *)(fileN_1.field_2._M_local_buf + 8));
        CustomComponentInstallDirectory_abi_cxx11_((string *)local_b80,this,sVar13);
        poVar6 = std::operator<<((ostream *)&__range1_1,"  RMDir \"");
        poVar6 = std::operator<<(poVar6,(string *)local_b80);
        poVar6 = std::operator<<(poVar6,"\\");
        poVar6 = std::operator<<(poVar6,(string *)&slash);
        poVar6 = std::operator<<(poVar6,"\"");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                   ::operator[](&(this->super_cmCPackGenerator).Components,
                                (key_type *)((long)&fileN_1.field_2 + 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&pmVar8->Directories,(value_type *)&slash);
        }
        std::__cxx11::string::~string((string *)local_b80);
        nsisInInstallOptions.field_2._12_4_ = 0;
      }
      else {
        nsisInInstallOptions.field_2._12_4_ = 0xb;
      }
      std::__cxx11::string::~string((string *)&slash);
      std::__cxx11::string::~string((string *)(fileN_1.field_2._M_local_buf + 8));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1_1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d08);
    poVar6 = std::operator<<((ostream *)local_d08,"Uninstall Dirs: ");
    std::__cxx11::ostringstream::str();
    poVar6 = std::operator<<(poVar6,local_d28);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_d28);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x7c,pcVar7);
    std::__cxx11::string::~string(local_d48);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d08);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d68,"CPACK_NSIS_DELETE_DIRECTORIES",&local_d69);
    std::__cxx11::ostringstream::str();
    cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_d68,&local_d90);
    std::__cxx11::string::~string((string *)&local_d90);
    std::__cxx11::string::~string((string *)&local_d68);
    std::allocator<char>::~allocator(&local_d69);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f08);
    poVar6 = std::operator<<((ostream *)local_f08,"Configure file: ");
    poVar6 = std::operator<<(poVar6,(string *)local_38);
    poVar6 = std::operator<<(poVar6," to ");
    poVar6 = std::operator<<(poVar6,(string *)local_420);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x81,pcVar7);
    std::__cxx11::string::~string(local_f28);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f08);
    std::allocator<char>::allocator();
    installerIconCode.field_2._M_local_buf[0xe] = '\0';
    installerIconCode.field_2._M_local_buf[0xd] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f48,"CPACK_NSIS_MUI_ICON",&local_f49);
    bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_f48);
    local_2c7a = true;
    if (!bVar3) {
      std::allocator<char>::allocator();
      installerIconCode.field_2._M_local_buf[0xe] = '\x01';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f70,"CPACK_NSIS_MUI_UNIICON",
                 (allocator<char> *)(installerIconCode.field_2._M_local_buf + 0xf));
      installerIconCode.field_2._M_local_buf[0xd] = '\x01';
      local_2c7a = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_f70);
    }
    if ((installerIconCode.field_2._M_local_buf[0xd] & 1U) != 0) {
      std::__cxx11::string::~string((string *)&local_f70);
    }
    if ((installerIconCode.field_2._M_local_buf[0xe] & 1U) != 0) {
      std::allocator<char>::~allocator
                ((allocator<char> *)(installerIconCode.field_2._M_local_buf + 0xf));
    }
    std::__cxx11::string::~string((string *)&local_f48);
    std::allocator<char>::~allocator(&local_f49);
    if (local_2c7a != false) {
      std::__cxx11::string::string(local_f98);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_fb8,"CPACK_NSIS_MUI_ICON",&local_fb9);
      bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_fb8);
      std::__cxx11::string::~string((string *)&local_fb8);
      std::allocator<char>::~allocator(&local_fb9);
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1008,"CPACK_NSIS_MUI_ICON",&local_1009);
        local_fe8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1008);
        cmStrCat<char_const(&)[19],cmValue,char_const(&)[3]>
                  (&local_fe0,(char (*) [19])"!define MUI_ICON \"",&local_fe8,
                   (char (*) [3])0x107e4ad);
        std::__cxx11::string::operator+=(local_f98,(string *)&local_fe0);
        std::__cxx11::string::~string((string *)&local_fe0);
        std::__cxx11::string::~string((string *)&local_1008);
        std::allocator<char>::~allocator(&local_1009);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1030,"CPACK_NSIS_MUI_UNIICON",&local_1031);
      bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_1030);
      std::__cxx11::string::~string((string *)&local_1030);
      std::allocator<char>::~allocator(&local_1031);
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1080,"CPACK_NSIS_MUI_UNIICON",&local_1081);
        local_1060 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1080);
        cmStrCat<char_const(&)[21],cmValue,char_const(&)[3]>
                  (&local_1058,(char (*) [21])"!define MUI_UNICON \"",&local_1060,
                   (char (*) [3])0x107e4ad);
        std::__cxx11::string::operator+=(local_f98,(string *)&local_1058);
        std::__cxx11::string::~string((string *)&local_1058);
        std::__cxx11::string::~string((string *)&local_1080);
        std::allocator<char>::~allocator(&local_1081);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_10a8,"CPACK_NSIS_INSTALLER_MUI_ICON_CODE",
                 (allocator<char> *)(installerHeaderImage.field_2._M_local_buf + 0xf));
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_10a8,pcVar7);
      std::__cxx11::string::~string((string *)&local_10a8);
      std::allocator<char>::~allocator
                ((allocator<char> *)(installerHeaderImage.field_2._M_local_buf + 0xf));
      std::__cxx11::string::~string(local_f98);
    }
    std::__cxx11::string::string((string *)local_10d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_10f0,"CPACK_NSIS_MUI_HEADERIMAGE",&local_10f1);
    bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_10f0);
    std::__cxx11::string::~string((string *)&local_10f0);
    std::allocator<char>::~allocator(&local_10f1);
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1120,"CPACK_NSIS_MUI_HEADERIMAGE",&local_1121);
      local_1100 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1120);
      psVar5 = cmValue::operator*[abi_cxx11_(&local_1100);
      std::__cxx11::string::operator=((string *)local_10d0,(string *)psVar5);
      std::__cxx11::string::~string((string *)&local_1120);
      std::allocator<char>::~allocator(&local_1121);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1148,"CPACK_PACKAGE_ICON",&local_1149);
      bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_1148);
      std::__cxx11::string::~string((string *)&local_1148);
      std::allocator<char>::~allocator(&local_1149);
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1178,"CPACK_PACKAGE_ICON",
                   (allocator<char> *)(installerIconCode_1.field_2._M_local_buf + 0xf));
        local_1158 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1178);
        psVar5 = cmValue::operator*[abi_cxx11_(&local_1158);
        std::__cxx11::string::operator=((string *)local_10d0,(string *)psVar5);
        std::__cxx11::string::~string((string *)&local_1178);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(installerIconCode_1.field_2._M_local_buf + 0xf));
      }
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      cmStrCat<char_const(&)[33],std::__cxx11::string&,char_const(&)[3]>
                ((string *)local_11a0,(char (*) [33])"!define MUI_HEADERIMAGE_BITMAP \"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10d0,
                 (char (*) [3])0x107e4ad);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_11c0,"CPACK_NSIS_INSTALLER_ICON_CODE",&local_11c1);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,&local_11c0,(string *)local_11a0);
      std::__cxx11::string::~string((string *)&local_11c0);
      std::allocator<char>::~allocator(&local_11c1);
      std::__cxx11::string::~string((string *)local_11a0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_11e8,"CPACK_NSIS_MUI_WELCOMEFINISHPAGE_BITMAP",
               (allocator<char> *)(installerBitmapCode.field_2._M_local_buf + 0xf));
    bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_11e8);
    std::__cxx11::string::~string((string *)&local_11e8);
    std::allocator<char>::~allocator
              ((allocator<char> *)(installerBitmapCode.field_2._M_local_buf + 0xf));
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1238,"CPACK_NSIS_MUI_WELCOMEFINISHPAGE_BITMAP",&local_1239);
      local_1218 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1238);
      cmStrCat<char_const(&)[39],cmValue,char_const(&)[3]>
                ((string *)local_1210,(char (*) [39])"!define MUI_WELCOMEFINISHPAGE_BITMAP \"",
                 &local_1218,(char (*) [3])0x107e4ad);
      std::__cxx11::string::~string((string *)&local_1238);
      std::allocator<char>::~allocator(&local_1239);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1260,"CPACK_NSIS_INSTALLER_MUI_WELCOMEFINISH_CODE",&local_1261);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,&local_1260,(string *)local_1210);
      std::__cxx11::string::~string((string *)&local_1260);
      std::allocator<char>::~allocator(&local_1261);
      std::__cxx11::string::~string((string *)local_1210);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1288,"CPACK_NSIS_MUI_UNWELCOMEFINISHPAGE_BITMAP",
               (allocator<char> *)(installerBitmapCode_1.field_2._M_local_buf + 0xf));
    bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_1288);
    std::__cxx11::string::~string((string *)&local_1288);
    std::allocator<char>::~allocator
              ((allocator<char> *)(installerBitmapCode_1.field_2._M_local_buf + 0xf));
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_12d8,"CPACK_NSIS_MUI_UNWELCOMEFINISHPAGE_BITMAP",&local_12d9);
      local_12b8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_12d8);
      cmStrCat<char_const(&)[41],cmValue,char_const(&)[3]>
                ((string *)local_12b0,(char (*) [41])"!define MUI_UNWELCOMEFINISHPAGE_BITMAP \"",
                 &local_12b8,(char (*) [3])0x107e4ad);
      std::__cxx11::string::~string((string *)&local_12d8);
      std::allocator<char>::~allocator(&local_12d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1300,"CPACK_NSIS_INSTALLER_MUI_UNWELCOMEFINISH_CODE",&local_1301);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,&local_1300,(string *)local_12b0);
      std::__cxx11::string::~string((string *)&local_1300);
      std::allocator<char>::~allocator(&local_1301);
      std::__cxx11::string::~string((string *)local_12b0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1328,"CPACK_NSIS_MUI_FINISHPAGE_RUN",
               (allocator<char> *)(installerRunCode.field_2._M_local_buf + 0xf));
    bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_1328);
    std::__cxx11::string::~string((string *)&local_1328);
    std::allocator<char>::~allocator
              ((allocator<char> *)(installerRunCode.field_2._M_local_buf + 0xf));
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1378,"CPACK_NSIS_EXECUTABLES_DIRECTORY",&local_1379);
      local_1358 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1378);
      local_137a = '\\';
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_13a8,"CPACK_NSIS_MUI_FINISHPAGE_RUN",&local_13a9);
      local_1388 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_13a8);
      cmStrCat<char_const(&)[38],cmValue,char,cmValue,char_const(&)[3]>
                ((string *)local_1350,(char (*) [38])"!define MUI_FINISHPAGE_RUN \"$INSTDIR\\",
                 &local_1358,&local_137a,&local_1388,(char (*) [3])0x107e4ad);
      std::__cxx11::string::~string((string *)&local_13a8);
      std::allocator<char>::~allocator(&local_13a9);
      std::__cxx11::string::~string((string *)&local_1378);
      std::allocator<char>::~allocator(&local_1379);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_13d0,"CPACK_NSIS_INSTALLER_MUI_FINISHPAGE_RUN_CODE",&local_13d1);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,&local_13d0,(string *)local_1350);
      std::__cxx11::string::~string((string *)&local_13d0);
      std::allocator<char>::~allocator(&local_13d1);
      std::__cxx11::string::~string((string *)local_1350);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_13f8,"CPACK_NSIS_WELCOME_TITLE",
               (allocator<char> *)(welcomeTitleCode.field_2._M_local_buf + 0xf));
    bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_13f8);
    std::__cxx11::string::~string((string *)&local_13f8);
    std::allocator<char>::~allocator
              ((allocator<char> *)(welcomeTitleCode.field_2._M_local_buf + 0xf));
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1448,"CPACK_NSIS_WELCOME_TITLE",&local_1449);
      local_1428 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1448);
      cmStrCat<char_const(&)[32],cmValue,char_const(&)[2]>
                ((string *)local_1420,(char (*) [32])"!define MUI_WELCOMEPAGE_TITLE \"",&local_1428,
                 (char (*) [2])0x107e386);
      std::__cxx11::string::~string((string *)&local_1448);
      std::allocator<char>::~allocator(&local_1449);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1470,"CPACK_NSIS_INSTALLER_WELCOME_TITLE_CODE",&local_1471);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,&local_1470,(string *)local_1420);
      std::__cxx11::string::~string((string *)&local_1470);
      std::allocator<char>::~allocator(&local_1471);
      std::__cxx11::string::~string((string *)local_1420);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1498,"CPACK_NSIS_WELCOME_TITLE_3LINES",&local_1499);
    bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_1498);
    std::__cxx11::string::~string((string *)&local_1498);
    std::allocator<char>::~allocator(&local_1499);
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_14c0,"CPACK_NSIS_INSTALLER_WELCOME_TITLE_3LINES_CODE",&local_14c1)
      ;
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,&local_14c0,"!define MUI_WELCOMEPAGE_TITLE_3LINES");
      std::__cxx11::string::~string((string *)&local_14c0);
      std::allocator<char>::~allocator(&local_14c1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_14e8,"CPACK_NSIS_FINISH_TITLE",
               (allocator<char> *)(finishTitleCode.field_2._M_local_buf + 0xf));
    bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_14e8);
    std::__cxx11::string::~string((string *)&local_14e8);
    std::allocator<char>::~allocator
              ((allocator<char> *)(finishTitleCode.field_2._M_local_buf + 0xf));
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1538,"CPACK_NSIS_FINISH_TITLE",&local_1539);
      local_1518 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1538);
      cmStrCat<char_const(&)[31],cmValue,char_const(&)[2]>
                ((string *)local_1510,(char (*) [31])"!define MUI_FINISHPAGE_TITLE \"",&local_1518,
                 (char (*) [2])0x107e386);
      std::__cxx11::string::~string((string *)&local_1538);
      std::allocator<char>::~allocator(&local_1539);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1560,"CPACK_NSIS_INSTALLER_FINISH_TITLE_CODE",&local_1561);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,&local_1560,(string *)local_1510);
      std::__cxx11::string::~string((string *)&local_1560);
      std::allocator<char>::~allocator(&local_1561);
      std::__cxx11::string::~string((string *)local_1510);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1588,"CPACK_NSIS_FINISH_TITLE_3LINES",&local_1589);
    bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_1588);
    std::__cxx11::string::~string((string *)&local_1588);
    std::allocator<char>::~allocator(&local_1589);
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_15b0,"CPACK_NSIS_INSTALLER_FINISH_TITLE_3LINES_CODE",&local_15b1);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,&local_15b0,"!define MUI_FINISHPAGE_TITLE_3LINES");
      std::__cxx11::string::~string((string *)&local_15b0);
      std::allocator<char>::~allocator(&local_15b1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_15d8,"CPACK_NSIS_MANIFEST_DPI_AWARE",&local_15d9);
    bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_15d8);
    std::__cxx11::string::~string((string *)&local_15d8);
    std::allocator<char>::~allocator(&local_15d9);
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1600,"CPACK_NSIS_MANIFEST_DPI_AWARE_CODE",&local_1601);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,&local_1600,"ManifestDPIAware true");
      std::__cxx11::string::~string((string *)&local_1600);
      std::allocator<char>::~allocator(&local_1601);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1628,"CPACK_NSIS_BRANDING_TEXT",
               (allocator<char> *)(brandingTextPosition.field_2._M_local_buf + 0xf));
    bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_1628);
    std::__cxx11::string::~string((string *)&local_1628);
    std::allocator<char>::~allocator
              ((allocator<char> *)(brandingTextPosition.field_2._M_local_buf + 0xf));
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_1650,"LEFT",&local_1651);
      std::allocator<char>::~allocator(&local_1651);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1678,"CPACK_NSIS_BRANDING_TEXT_TRIM_POSITION",
                 (allocator<char> *)(wantedPosition.field_2._M_local_buf + 0xf));
      bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_1678);
      std::__cxx11::string::~string((string *)&local_1678);
      std::allocator<char>::~allocator
                ((allocator<char> *)(wantedPosition.field_2._M_local_buf + 0xf));
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_16c8,"CPACK_NSIS_BRANDING_TEXT_TRIM_POSITION",
                   (allocator<char> *)
                   ((long)&possiblePositions._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
        local_16a8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_16c8);
        psVar5 = cmValue::operator_cast_to_string_(&local_16a8);
        std::__cxx11::string::string((string *)local_16a0,(string *)psVar5);
        std::__cxx11::string::~string((string *)&local_16c8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&possiblePositions._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          local_177c = 1;
          local_1778 = &local_1770;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1770,"CENTER",&local_1779);
          local_1778 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1750;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_1750,"LEFT",&local_177a);
          local_1778 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1730;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_1730,"RIGHT",&local_177b);
          local_177c = 0;
          local_1710 = &local_1770;
          local_1708 = 3;
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator(&local_177e);
          __l._M_len = local_1708;
          __l._M_array = local_1710;
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1700,__l,&local_177d,&local_177e);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator(&local_177e);
          local_2eb8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1710;
          do {
            local_2eb8 = local_2eb8 + -1;
            std::__cxx11::string::~string((string *)local_2eb8);
          } while (local_2eb8 != &local_1770);
          std::allocator<char>::~allocator(&local_177b);
          std::allocator<char>::~allocator(&local_177a);
          std::allocator<char>::~allocator(&local_1779);
          local_1788._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1700,(key_type *)local_16a0);
          local_1790._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1700);
          bVar3 = std::operator==(&local_1788,&local_1790);
          if (bVar3) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1908);
            poVar6 = std::operator<<((ostream *)local_1908,
                                     "Unsupported branding text trim position ");
            poVar6 = std::operator<<(poVar6,(string *)local_16a0);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            pcVar1 = (this->super_cmCPackGenerator).Logger;
            std::__cxx11::ostringstream::str();
            pcVar7 = (char *)std::__cxx11::string::c_str();
            cmCPackLog::Log(pcVar1,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                            ,0xe3,pcVar7);
            std::__cxx11::string::~string((string *)(brandingTextCode.field_2._M_local_buf + 8));
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1908);
            this_local._4_4_ = 0;
          }
          else {
            std::__cxx11::string::operator=((string *)local_1650,(string *)local_16a0);
          }
          nsisInInstallOptions.field_2._13_3_ = 0;
          nsisInInstallOptions.field_2._M_local_buf[0xc] = bVar3;
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1700);
          if (nsisInInstallOptions.field_2._12_4_ == 0) goto LAB_001e9be5;
        }
        else {
LAB_001e9be5:
          nsisInInstallOptions.field_2._12_4_ = 0;
        }
        std::__cxx11::string::~string((string *)local_16a0);
        if (nsisInInstallOptions.field_2._12_4_ == 0) goto LAB_001e9c1e;
      }
      else {
LAB_001e9c1e:
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1970,"CPACK_NSIS_BRANDING_TEXT",&local_1971);
        local_1950 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1970);
        cmStrCat<char_const(&)[19],std::__cxx11::string&,char_const(&)[3],cmValue,char_const(&)[3]>
                  ((string *)local_1948,(char (*) [19])"BrandingText /TRIM",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1650,
                   (char (*) [3])0x1052ae9,&local_1950,(char (*) [3])0x107e4ad);
        std::__cxx11::string::~string((string *)&local_1970);
        std::allocator<char>::~allocator(&local_1971);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1998,"CPACK_NSIS_BRANDING_TEXT_CODE",&local_1999);
        cmCPackGenerator::SetOptionIfNotSet
                  (&this->super_cmCPackGenerator,&local_1998,(string *)local_1948);
        std::__cxx11::string::~string((string *)&local_1998);
        std::allocator<char>::~allocator(&local_1999);
        std::__cxx11::string::~string((string *)local_1948);
        nsisInInstallOptions.field_2._12_4_ = 0;
      }
      std::__cxx11::string::~string((string *)local_1650);
      if (nsisInInstallOptions.field_2._12_4_ == 0) goto LAB_001e9df5;
    }
    else {
LAB_001e9df5:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_19c0,"CPACK_NSIS_IGNORE_LICENSE_PAGE",
                 (allocator<char> *)(licenceCode.field_2._M_local_buf + 0xf));
      bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_19c0);
      std::__cxx11::string::~string((string *)&local_19c0);
      std::allocator<char>::~allocator((allocator<char> *)(licenceCode.field_2._M_local_buf + 0xf));
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a10,"CPACK_RESOURCE_FILE_LICENSE",&local_1a11);
        local_19f0 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1a10);
        cmStrCat<char_const(&)[32],cmValue,char_const(&)[3]>
                  ((string *)local_19e8,(char (*) [32])"!insertmacro MUI_PAGE_LICENSE \"",
                   &local_19f0,(char (*) [3])0x107e4ad);
        std::__cxx11::string::~string((string *)&local_1a10);
        std::allocator<char>::~allocator(&local_1a11);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a38,"CPACK_NSIS_LICENSE_PAGE",
                   (allocator<char> *)(nsisPreArguments.field_2._M_local_buf + 0xf));
        cmCPackGenerator::SetOptionIfNotSet
                  (&this->super_cmCPackGenerator,&local_1a38,(string *)local_19e8);
        std::__cxx11::string::~string((string *)&local_1a38);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(nsisPreArguments.field_2._M_local_buf + 0xf));
        std::__cxx11::string::~string((string *)local_19e8);
      }
      std::__cxx11::string::string((string *)&nsisArguments);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a88,"CPACK_NSIS_EXECUTABLE_PRE_ARGUMENTS",
                 (allocator<char> *)
                 ((long)&expandedArguments.Values.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      local_1a68 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1a88);
      std::__cxx11::string::~string((string *)&local_1a88);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&expandedArguments.Values.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      bVar3 = cmValue::operator_cast_to_bool(&local_1a68);
      if (bVar3) {
        psVar5 = cmValue::operator_cast_to_string_(&local_1a68);
        std::__cxx11::string::string((string *)&local_1ad8,(string *)psVar5);
        local_1ab8 = &local_1ad8;
        local_1ab0 = 1;
        init_00._M_len = 1;
        init_00._M_array = local_1ab8;
        cmList::cmList((cmList *)local_1aa8,init_00);
        local_2f70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_1ab8;
        do {
          local_2f70 = local_2f70 + -1;
          std::__cxx11::string::~string((string *)local_2f70);
        } while (local_2f70 != &local_1ad8);
        __end2 = cmList::begin_abi_cxx11_((cmList *)local_1aa8);
        arg = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              cmList::end_abi_cxx11_((cmList *)local_1aa8);
        while( true ) {
          bVar3 = __gnu_cxx::operator!=
                            (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&arg);
          if (!bVar3) break;
          local_1b00 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&__end2);
          sVar13 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1b00);
          local_1b10 = sVar13;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1b20,"-");
          bVar3 = cmHasPrefix(local_1b10,local_1b20);
          if (!bVar3) {
            cmStrCat<std::__cxx11::string&,char_const(&)[2]>
                      (&local_1b40,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &nsisArguments,(char (*) [2])0x108ce73);
            std::__cxx11::string::operator=((string *)&nsisArguments,(string *)&local_1b40);
            std::__cxx11::string::~string((string *)&local_1b40);
          }
          nsisPostArguments.field_2._M_local_buf[0xf] = ' ';
          cmStrCat<std::__cxx11::string&,std::__cxx11::string&,char>
                    (&local_1b60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &nsisArguments,local_1b00,nsisPostArguments.field_2._M_local_buf + 0xf);
          std::__cxx11::string::operator=((string *)&nsisArguments,(string *)&local_1b60);
          std::__cxx11::string::~string((string *)&local_1b60);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2);
        }
        cmList::~cmList((cmList *)local_1aa8);
      }
      std::__cxx11::string::string((string *)&nsisArguments_1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1bb0,"CPACK_NSIS_EXECUTABLE_POST_ARGUMENTS",
                 (allocator<char> *)
                 ((long)&expandedArguments_1.Values.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      local_1b90 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1bb0);
      std::__cxx11::string::~string((string *)&local_1bb0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&expandedArguments_1.Values.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      bVar3 = cmValue::operator_cast_to_bool(&local_1b90);
      if (bVar3) {
        psVar5 = cmValue::operator_cast_to_string_(&local_1b90);
        std::__cxx11::string::string((string *)&local_1c00,(string *)psVar5);
        local_1be0 = &local_1c00;
        local_1bd8 = 1;
        init._M_len = 1;
        init._M_array = local_1be0;
        cmList::cmList((cmList *)local_1bd0,init);
        local_2fd0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_1be0;
        do {
          local_2fd0 = local_2fd0 + -1;
          std::__cxx11::string::~string((string *)local_2fd0);
        } while (local_2fd0 != &local_1c00);
        __end2_1 = cmList::begin_abi_cxx11_((cmList *)local_1bd0);
        arg_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                cmList::end_abi_cxx11_((cmList *)local_1bd0);
        while( true ) {
          bVar3 = __gnu_cxx::operator!=
                            (&__end2_1,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&arg_1);
          if (!bVar3) break;
          local_1c28 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&__end2_1);
          sVar13 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1c28);
          local_1c38 = sVar13;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c48,"-");
          bVar3 = cmHasPrefix(local_1c38,local_1c48);
          if (!bVar3) {
            cmStrCat<std::__cxx11::string&,char_const(&)[2]>
                      (&local_1c68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &nsisArguments_1,(char (*) [2])0x108ce73);
            std::__cxx11::string::operator=((string *)&nsisArguments_1,(string *)&local_1c68);
            std::__cxx11::string::~string((string *)&local_1c68);
          }
          local_1c89 = ' ';
          cmStrCat<std::__cxx11::string&,std::__cxx11::string&,char>
                    (&local_1c88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &nsisArguments_1,local_1c28,&local_1c89);
          std::__cxx11::string::operator=((string *)&nsisArguments_1,(string *)&local_1c88);
          std::__cxx11::string::~string((string *)&local_1c88);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2_1);
        }
        cmList::~cmList((cmList *)local_1bd0);
      }
      bVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
              ::empty(&(this->super_cmCPackGenerator).Components);
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1cb0,"CPACK_NSIS_INSTALLATION_TYPES",&local_1cb1);
        cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_1cb0,"");
        std::__cxx11::string::~string((string *)&local_1cb0);
        std::allocator<char>::~allocator(&local_1cb1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1cd8,"CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC",&local_1cd9);
        cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_1cd8,"");
        std::__cxx11::string::~string((string *)&local_1cd8);
        std::allocator<char>::~allocator(&local_1cd9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1d00,"CPACK_NSIS_PAGE_COMPONENTS",&local_1d01);
        cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_1d00,"");
        std::__cxx11::string::~string((string *)&local_1d00);
        std::allocator<char>::~allocator(&local_1d01);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1d28,"CPACK_NSIS_FULL_INSTALL",&local_1d29);
        cmCPackGenerator::SetOptionIfNotSet
                  (&this->super_cmCPackGenerator,&local_1d28,"File /r \"${INST_DIR}\\*.*\"");
        std::__cxx11::string::~string((string *)&local_1d28);
        std::allocator<char>::~allocator(&local_1d29);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1d50,"CPACK_NSIS_COMPONENT_SECTIONS",&local_1d51);
        cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_1d50,"");
        std::__cxx11::string::~string((string *)&local_1d50);
        std::allocator<char>::~allocator(&local_1d51);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1d78,"CPACK_NSIS_COMPONENT_SECTION_LIST",&local_1d79);
        cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_1d78,"");
        std::__cxx11::string::~string((string *)&local_1d78);
        std::allocator<char>::~allocator(&local_1d79);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1da0,"CPACK_NSIS_SECTION_SELECTED_VARS",
                   (allocator<char> *)(componentCode.field_2._M_local_buf + 0xf));
        cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_1da0,"");
        std::__cxx11::string::~string((string *)&local_1da0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(componentCode.field_2._M_local_buf + 0xf));
      }
      else {
        std::__cxx11::string::string((string *)(sectionList.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)(selectedVarsList.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)(componentDescriptions.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)(groupDescriptions.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)(installTypesCode.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)(defines.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)local_1e88);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2000);
        installTypes.
        super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        __n = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>_>_>
              ::size(&(this->super_cmCPackGenerator).InstallationTypes);
        std::allocator<cmCPackInstallationType_*>::allocator
                  ((allocator<cmCPackInstallationType_*> *)((long)&__range2_2 + 7));
        std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>::vector
                  ((vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_> *)
                   local_2020,__n,(allocator<cmCPackInstallationType_*> *)((long)&__range2_2 + 7));
        std::allocator<cmCPackInstallationType_*>::~allocator
                  ((allocator<cmCPackInstallationType_*> *)((long)&__range2_2 + 7));
        this_01 = &(this->super_cmCPackGenerator).InstallationTypes;
        __end2_2 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>_>_>
                   ::begin(this_01);
        installType = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>
                       *)std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>_>_>
                         ::end(this_01);
        while( true ) {
          bVar3 = std::operator!=(&__end2_2,(_Self *)&installType);
          if (!bVar3) break;
          ppVar9 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>_>
                   ::operator*(&__end2_2);
          ppcVar10 = std::
                     vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>::
                     operator[]((vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                                 *)local_2020,(ulong)((ppVar9->second).Index - 1));
          *ppcVar10 = &ppVar9->second;
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>_>
          ::operator++(&__end2_2);
        }
        __end2_3 = std::
                   vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>::
                   begin((vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                          *)local_2020);
        installType_1 =
             (cmCPackInstallationType *)
             std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>::end
                       ((vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                         *)local_2020);
        while( true ) {
          bVar3 = __gnu_cxx::operator!=
                            (&__end2_3,
                             (__normal_iterator<cmCPackInstallationType_**,_std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>_>
                              *)&installType_1);
          if (!bVar3) break;
          ppcVar11 = __gnu_cxx::
                     __normal_iterator<cmCPackInstallationType_**,_std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>_>
                     ::operator*(&__end2_3);
          pcVar2 = *ppcVar11;
          std::__cxx11::string::operator+=
                    ((string *)(defines.field_2._M_local_buf + 8),"InstType \"");
          std::__cxx11::string::operator+=
                    ((string *)(defines.field_2._M_local_buf + 8),(string *)&pcVar2->DisplayName);
          std::__cxx11::string::operator+=((string *)(defines.field_2._M_local_buf + 8),"\"\n");
          __gnu_cxx::
          __normal_iterator<cmCPackInstallationType_**,_std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>_>
          ::operator++(&__end2_3);
        }
        this_02 = &(this->super_cmCPackGenerator).ComponentGroups;
        __end2_4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
                   ::begin(this_02);
        group = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>
                 *)std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
                   ::end(this_02);
        while( true ) {
          bVar3 = std::operator!=(&__end2_4,(_Self *)&group);
          if (!bVar3) break;
          local_2088 = std::
                       _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
                       ::operator*(&__end2_4);
          if ((local_2088->second).ParentGroup == (cmCPackComponentGroup *)0x0) {
            CreateComponentGroupDescription_abi_cxx11_
                      (&local_20a8,this,&local_2088->second,(ostream *)local_2000);
            std::__cxx11::string::operator+=
                      ((string *)(sectionList.field_2._M_local_buf + 8),(string *)&local_20a8);
            std::__cxx11::string::~string((string *)&local_20a8);
          }
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            std::operator+(&local_2128,"  !insertmacro MUI_DESCRIPTION_TEXT ${",&local_2088->first);
            std::operator+(&local_2108,&local_2128,"} \"");
            std::__cxx11::string::string
                      ((string *)&__range2_5,(string *)&(local_2088->second).Description);
            TranslateNewlines(&local_2148,(string *)&__range2_5);
            std::operator+(&local_20e8,&local_2108,&local_2148);
            std::operator+(&local_20c8,&local_20e8,"\"\n");
            std::__cxx11::string::operator+=
                      ((string *)(installTypesCode.field_2._M_local_buf + 8),(string *)&local_20c8);
            std::__cxx11::string::~string((string *)&local_20c8);
            std::__cxx11::string::~string((string *)&local_20e8);
            std::__cxx11::string::~string((string *)&local_2148);
            std::__cxx11::string::~string((string *)&__range2_5);
            std::__cxx11::string::~string((string *)&local_2108);
            std::__cxx11::string::~string((string *)&local_2128);
          }
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
          ::operator++(&__end2_4);
        }
        this_03 = &(this->super_cmCPackGenerator).Components;
        __end2_5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                   ::begin(this_03);
        comp = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>
                *)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                  ::end(this_03);
        while( true ) {
          bVar3 = std::operator!=(&__end2_5,(_Self *)&comp);
          if (!bVar3) break;
          local_2188 = std::
                       _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
                       ::operator*(&__end2_5);
          bVar3 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty(&(local_2188->second).Files);
          if (!bVar3) {
            local_3061 = 1;
            if ((installTypes.
                 super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
              local_3061 = (byte)(local_2188->second).field_0x48 >> 3 & 1;
            }
            installTypes.
            super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = local_3061;
            if ((local_2188->second).Group == (cmCPackComponentGroup *)0x0) {
              CreateComponentDescription_abi_cxx11_
                        (&local_21a8,this,&local_2188->second,(ostream *)local_2000);
              std::__cxx11::string::operator+=
                        ((string *)(sectionList.field_2._M_local_buf + 8),(string *)&local_21a8);
              std::__cxx11::string::~string((string *)&local_21a8);
            }
            std::__cxx11::string::operator+=
                      ((string *)(selectedVarsList.field_2._M_local_buf + 8),
                       "  !insertmacro \"${MacroName}\" \"");
            std::__cxx11::string::operator+=
                      ((string *)(selectedVarsList.field_2._M_local_buf + 8),(string *)local_2188);
            std::__cxx11::string::operator+=
                      ((string *)(selectedVarsList.field_2._M_local_buf + 8),"\"\n");
            std::operator+(&local_21e8,"Var ",&local_2188->first);
            std::operator+(&local_21c8,&local_21e8,"_selected\n");
            std::__cxx11::string::operator+=
                      ((string *)(componentDescriptions.field_2._M_local_buf + 8),
                       (string *)&local_21c8);
            std::__cxx11::string::~string((string *)&local_21c8);
            std::__cxx11::string::~string((string *)&local_21e8);
            std::operator+(&local_2228,"Var ",&local_2188->first);
            std::operator+(&local_2208,&local_2228,"_was_installed\n");
            std::__cxx11::string::operator+=
                      ((string *)(componentDescriptions.field_2._M_local_buf + 8),
                       (string *)&local_2208);
            std::__cxx11::string::~string((string *)&local_2208);
            std::__cxx11::string::~string((string *)&local_2228);
            uVar4 = std::__cxx11::string::empty();
            if ((uVar4 & 1) == 0) {
              std::operator+(&local_22a8,"  !insertmacro MUI_DESCRIPTION_TEXT ${",&local_2188->first
                            );
              std::operator+(&local_2288,&local_22a8,"} \"");
              std::__cxx11::string::string
                        ((string *)&local_22e8,(string *)&(local_2188->second).Description);
              TranslateNewlines(&local_22c8,&local_22e8);
              std::operator+(&local_2268,&local_2288,&local_22c8);
              std::operator+(&local_2248,&local_2268,"\"\n");
              std::__cxx11::string::operator+=
                        ((string *)(groupDescriptions.field_2._M_local_buf + 8),
                         (string *)&local_2248);
              std::__cxx11::string::~string((string *)&local_2248);
              std::__cxx11::string::~string((string *)&local_2268);
              std::__cxx11::string::~string((string *)&local_22c8);
              std::__cxx11::string::~string((string *)&local_22e8);
              std::__cxx11::string::~string((string *)&local_2288);
              std::__cxx11::string::~string((string *)&local_22a8);
            }
          }
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
          ::operator++(&__end2_5);
        }
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator+=
                  ((string *)(sectionList.field_2._M_local_buf + 8),local_2308);
        std::__cxx11::string::~string(local_2308);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
LAB_001eb7f5:
          std::operator+(&local_2390,"!insertmacro MUI_FUNCTION_DESCRIPTION_BEGIN\n",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&groupDescriptions.field_2 + 8));
          std::operator+(&local_2370,&local_2390,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&installTypesCode.field_2 + 8));
          std::operator+(&local_2350,&local_2370,"!insertmacro MUI_FUNCTION_DESCRIPTION_END\n");
          std::__cxx11::string::operator=
                    ((string *)(groupDescriptions.field_2._M_local_buf + 8),(string *)&local_2350);
          std::__cxx11::string::~string((string *)&local_2350);
          std::__cxx11::string::~string((string *)&local_2370);
          std::__cxx11::string::~string((string *)&local_2390);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_23b0,"CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC",&local_23b1);
          cmCPackGenerator::SetOptionIfNotSet
                    (&this->super_cmCPackGenerator,&local_23b0,
                     (string *)((long)&groupDescriptions.field_2 + 8));
          std::__cxx11::string::~string((string *)&local_23b0);
          std::allocator<char>::~allocator(&local_23b1);
        }
        else {
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) goto LAB_001eb7f5;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2328,"CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC",&local_2329);
          cmCPackGenerator::SetOptionIfNotSet
                    (&this->super_cmCPackGenerator,&local_2328,"!define MUI_COMPONENTSPAGE_NODESC");
          std::__cxx11::string::~string((string *)&local_2328);
          std::allocator<char>::~allocator(&local_2329);
        }
        if ((installTypes.
             super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
          std::__cxx11::string::operator+=((string *)local_1e88,"!define CPACK_USES_DOWNLOAD\n");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_23e0,"CPACK_ADD_REMOVE",&local_23e1);
          local_23c0 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_23e0);
          bVar3 = cmValue::IsOn(&local_23c0);
          std::__cxx11::string::~string((string *)&local_23e0);
          std::allocator<char>::~allocator(&local_23e1);
          if (bVar3) {
            std::__cxx11::string::operator+=((string *)local_1e88,"!define CPACK_NSIS_ADD_REMOVE\n")
            ;
          }
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2408,"CPACK_NSIS_INSTALLATION_TYPES",&local_2409);
        cmCPackGenerator::SetOptionIfNotSet
                  (&this->super_cmCPackGenerator,&local_2408,(string *)((long)&defines.field_2 + 8))
        ;
        std::__cxx11::string::~string((string *)&local_2408);
        std::allocator<char>::~allocator(&local_2409);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2430,"CPACK_NSIS_PAGE_COMPONENTS",&local_2431);
        cmCPackGenerator::SetOptionIfNotSet
                  (&this->super_cmCPackGenerator,&local_2430,"!insertmacro MUI_PAGE_COMPONENTS");
        std::__cxx11::string::~string((string *)&local_2430);
        std::allocator<char>::~allocator(&local_2431);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2458,"CPACK_NSIS_FULL_INSTALL",&local_2459);
        cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_2458,"");
        std::__cxx11::string::~string((string *)&local_2458);
        std::allocator<char>::~allocator(&local_2459);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2480,"CPACK_NSIS_COMPONENT_SECTIONS",&local_2481);
        cmCPackGenerator::SetOptionIfNotSet
                  (&this->super_cmCPackGenerator,&local_2480,
                   (string *)((long)&sectionList.field_2 + 8));
        std::__cxx11::string::~string((string *)&local_2480);
        std::allocator<char>::~allocator(&local_2481);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_24a8,"CPACK_NSIS_COMPONENT_SECTION_LIST",&local_24a9);
        cmCPackGenerator::SetOptionIfNotSet
                  (&this->super_cmCPackGenerator,&local_24a8,
                   (string *)((long)&selectedVarsList.field_2 + 8));
        std::__cxx11::string::~string((string *)&local_24a8);
        std::allocator<char>::~allocator(&local_24a9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_24d0,"CPACK_NSIS_SECTION_SELECTED_VARS",&local_24d1);
        cmCPackGenerator::SetOptionIfNotSet
                  (&this->super_cmCPackGenerator,&local_24d0,
                   (string *)((long)&componentDescriptions.field_2 + 8));
        std::__cxx11::string::~string((string *)&local_24d0);
        std::allocator<char>::~allocator(&local_24d1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_24f8,"CPACK_NSIS_DEFINES",
                   (allocator<char> *)(nsisCmd.field_2._M_local_buf + 0xf));
        cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_24f8,(string *)local_1e88);
        std::__cxx11::string::~string((string *)&local_24f8);
        std::allocator<char>::~allocator((allocator<char> *)(nsisCmd.field_2._M_local_buf + 0xf));
        std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>::~vector
                  ((vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_> *)
                   local_2020);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2000);
        std::__cxx11::string::~string((string *)local_1e88);
        std::__cxx11::string::~string((string *)(defines.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(installTypesCode.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(groupDescriptions.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(componentDescriptions.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(selectedVarsList.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(sectionList.field_2._M_local_buf + 8));
      }
      (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0xc])(this,local_238,local_490,0);
      (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0xc])(this,local_38,local_420,0);
      local_2521 = '\"';
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2550,"CPACK_INSTALLER_PROGRAM",&local_2551);
      local_2530 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_2550);
      local_2552 = '\"';
      cmStrCat<char,cmValue,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char>
                ((string *)local_2520,&local_2521,&local_2530,(char (*) [3])0x108db75,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nsisArguments
                 ,(char (*) [3])0x1052ae9,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_420,
                 &local_2552);
      std::__cxx11::string::~string((string *)&local_2550);
      std::allocator<char>::~allocator(&local_2551);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        cmStrCat<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                  (&local_2578,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2520,
                   (char (*) [2])0x106c769,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &nsisArguments_1);
        std::__cxx11::string::operator=((string *)local_2520,(string *)&local_2578);
        std::__cxx11::string::~string((string *)&local_2578);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_26f0);
      poVar6 = std::operator<<((ostream *)local_26f0,"Execute: ");
      poVar6 = std::operator<<(poVar6,(string *)local_2520);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                      ,0x188,pcVar7);
      std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_26f0);
      std::__cxx11::string::string((string *)local_2730);
      local_2734 = 1;
      outputflag = (this->super_cmCPackGenerator).GeneratorVerbose;
      ofs._608_8_ = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
      bVar3 = cmSystemTools::RunSingleCommand
                        ((string *)local_2520,(string *)local_2730,(string *)local_2730,&local_2734,
                         (char *)0x0,outputflag,(cmDuration)ofs._608_8_);
      if ((bVar3) && (local_2734 == 0)) {
        this_local._4_4_ = 1;
        nsisInInstallOptions.field_2._12_4_ = 1;
      }
      else {
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)local_29a8,
                   (string *)((long)&nsisInstallOptions.field_2 + 8),false,None);
        poVar6 = std::operator<<((ostream *)local_29a8,"# Run command: ");
        poVar6 = std::operator<<(poVar6,(string *)local_2520);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<(poVar6,"# Output:");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<(poVar6,(string *)local_2730);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b20);
        poVar6 = std::operator<<((ostream *)local_2b20,"Problem running NSIS command: ");
        poVar6 = std::operator<<(poVar6,(string *)local_2520);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<(poVar6,"Please check ");
        poVar6 = std::operator<<(poVar6,(string *)(nsisInstallOptions.field_2._M_local_buf + 8));
        poVar6 = std::operator<<(poVar6," for errors");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                        ,0x197,pcVar7);
        std::__cxx11::string::~string(local_2b40);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b20);
        this_local._4_4_ = 0;
        nsisInInstallOptions.field_2._12_4_ = 1;
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_29a8);
      }
      std::__cxx11::string::~string((string *)local_2730);
      std::__cxx11::string::~string((string *)local_2520);
      std::__cxx11::string::~string((string *)&nsisArguments_1);
      std::__cxx11::string::~string((string *)&nsisArguments);
    }
    std::__cxx11::string::~string((string *)local_10d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range1_1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_948);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range1);
    std::__cxx11::string::~string((string *)local_490);
    std::__cxx11::string::~string((string *)(nsisInstallOptions.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_420);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
    poVar6 = std::operator<<((ostream *)local_3e0,
                             "CPack error: Could not find NSIS installer options file.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x39,pcVar7);
    std::__cxx11::string::~string((string *)(nsisFileName.field_2._M_local_buf + 8));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e0);
    this_local._4_4_ = 0;
    nsisInInstallOptions.field_2._12_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_238);
LAB_001ec749:
  std::__cxx11::string::~string((string *)local_38);
  return this_local._4_4_;
}

Assistant:

int cmCPackNSISGenerator::PackageFiles()
{
  // TODO: Fix nsis to force out file name

  std::string nsisInFileName = this->FindTemplate("NSIS.template.in");
  if (nsisInFileName.empty()) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "CPack error: Could not find NSIS installer template file."
                    << std::endl);
    return false;
  }
  std::string nsisInInstallOptions =
    this->FindTemplate("NSIS.InstallOptions.ini.in");
  if (nsisInInstallOptions.empty()) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "CPack error: Could not find NSIS installer options file."
                    << std::endl);
    return false;
  }

  std::string nsisFileName = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
  std::string tmpFile = cmStrCat(nsisFileName, "/NSISOutput.log");
  std::string nsisInstallOptions = nsisFileName + "/NSIS.InstallOptions.ini";
  nsisFileName += "/project.nsi";
  std::ostringstream str;
  for (std::string const& file : this->files) {
    std::string outputDir = "$INSTDIR";
    std::string fileN = cmSystemTools::RelativePath(this->toplevel, file);
    if (!this->Components.empty()) {
      const std::string::size_type pos = fileN.find('/');

      // Use the custom component install directory if we have one
      if (pos != std::string::npos) {
        auto componentName = cm::string_view(fileN).substr(0, pos);
        outputDir = this->CustomComponentInstallDirectory(componentName);
      } else {
        outputDir = this->CustomComponentInstallDirectory(fileN);
      }

      // Strip off the component part of the path.
      fileN = fileN.substr(pos + 1);
    }
    std::replace(fileN.begin(), fileN.end(), '/', '\\');

    str << "  Delete \"" << outputDir << "\\" << fileN << "\"" << std::endl;
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Uninstall Files: " << str.str() << std::endl);
  this->SetOptionIfNotSet("CPACK_NSIS_DELETE_FILES", str.str());
  std::vector<std::string> dirs;
  this->GetListOfSubdirectories(this->toplevel.c_str(), dirs);
  std::ostringstream dstr;
  for (std::string const& dir : dirs) {
    std::string componentName;
    std::string fileN = cmSystemTools::RelativePath(this->toplevel, dir);
    if (fileN.empty()) {
      continue;
    }
    if (!this->Components.empty()) {
      // If this is a component installation, strip off the component
      // part of the path.
      std::string::size_type slash = fileN.find('/');
      if (slash != std::string::npos) {
        // If this is a component installation, determine which component it
        // is.
        componentName = fileN.substr(0, slash);

        // Strip off the component part of the path.
        fileN.erase(0, slash + 1);
      }
    }
    std::replace(fileN.begin(), fileN.end(), '/', '\\');

    const std::string componentOutputDir =
      this->CustomComponentInstallDirectory(componentName);

    dstr << "  RMDir \"" << componentOutputDir << "\\" << fileN << "\""
         << std::endl;
    if (!componentName.empty()) {
      this->Components[componentName].Directories.push_back(std::move(fileN));
    }
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Uninstall Dirs: " << dstr.str() << std::endl);
  this->SetOptionIfNotSet("CPACK_NSIS_DELETE_DIRECTORIES", dstr.str());

  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Configure file: " << nsisInFileName << " to " << nsisFileName
                                   << std::endl);
  if (this->IsSet("CPACK_NSIS_MUI_ICON") ||
      this->IsSet("CPACK_NSIS_MUI_UNIICON")) {
    std::string installerIconCode;
    if (this->IsSet("CPACK_NSIS_MUI_ICON")) {
      installerIconCode += cmStrCat(
        "!define MUI_ICON \"", this->GetOption("CPACK_NSIS_MUI_ICON"), "\"\n");
    }
    if (this->IsSet("CPACK_NSIS_MUI_UNIICON")) {
      installerIconCode +=
        cmStrCat("!define MUI_UNICON \"",
                 this->GetOption("CPACK_NSIS_MUI_UNIICON"), "\"\n");
    }
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_ICON_CODE",
                            installerIconCode.c_str());
  }
  std::string installerHeaderImage;
  if (this->IsSet("CPACK_NSIS_MUI_HEADERIMAGE")) {
    installerHeaderImage = *this->GetOption("CPACK_NSIS_MUI_HEADERIMAGE");
  } else if (this->IsSet("CPACK_PACKAGE_ICON")) {
    installerHeaderImage = *this->GetOption("CPACK_PACKAGE_ICON");
  }
  if (!installerHeaderImage.empty()) {
    std::string installerIconCode = cmStrCat(
      "!define MUI_HEADERIMAGE_BITMAP \"", installerHeaderImage, "\"\n");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_ICON_CODE",
                            installerIconCode);
  }

  if (this->IsSet("CPACK_NSIS_MUI_WELCOMEFINISHPAGE_BITMAP")) {
    std::string installerBitmapCode = cmStrCat(
      "!define MUI_WELCOMEFINISHPAGE_BITMAP \"",
      this->GetOption("CPACK_NSIS_MUI_WELCOMEFINISHPAGE_BITMAP"), "\"\n");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_WELCOMEFINISH_CODE",
                            installerBitmapCode);
  }

  if (this->IsSet("CPACK_NSIS_MUI_UNWELCOMEFINISHPAGE_BITMAP")) {
    std::string installerBitmapCode = cmStrCat(
      "!define MUI_UNWELCOMEFINISHPAGE_BITMAP \"",
      this->GetOption("CPACK_NSIS_MUI_UNWELCOMEFINISHPAGE_BITMAP"), "\"\n");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_UNWELCOMEFINISH_CODE",
                            installerBitmapCode);
  }

  if (this->IsSet("CPACK_NSIS_MUI_FINISHPAGE_RUN")) {
    std::string installerRunCode =
      cmStrCat("!define MUI_FINISHPAGE_RUN \"$INSTDIR\\",
               this->GetOption("CPACK_NSIS_EXECUTABLES_DIRECTORY"), '\\',
               this->GetOption("CPACK_NSIS_MUI_FINISHPAGE_RUN"), "\"\n");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_FINISHPAGE_RUN_CODE",
                            installerRunCode);
  }

  if (this->IsSet("CPACK_NSIS_WELCOME_TITLE")) {
    std::string welcomeTitleCode =
      cmStrCat("!define MUI_WELCOMEPAGE_TITLE \"",
               this->GetOption("CPACK_NSIS_WELCOME_TITLE"), "\"");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_WELCOME_TITLE_CODE",
                            welcomeTitleCode);
  }

  if (this->IsSet("CPACK_NSIS_WELCOME_TITLE_3LINES")) {
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_WELCOME_TITLE_3LINES_CODE",
                            "!define MUI_WELCOMEPAGE_TITLE_3LINES");
  }

  if (this->IsSet("CPACK_NSIS_FINISH_TITLE")) {
    std::string finishTitleCode =
      cmStrCat("!define MUI_FINISHPAGE_TITLE \"",
               this->GetOption("CPACK_NSIS_FINISH_TITLE"), "\"");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_FINISH_TITLE_CODE",
                            finishTitleCode);
  }

  if (this->IsSet("CPACK_NSIS_FINISH_TITLE_3LINES")) {
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_FINISH_TITLE_3LINES_CODE",
                            "!define MUI_FINISHPAGE_TITLE_3LINES");
  }

  if (this->IsSet("CPACK_NSIS_MANIFEST_DPI_AWARE")) {
    this->SetOptionIfNotSet("CPACK_NSIS_MANIFEST_DPI_AWARE_CODE",
                            "ManifestDPIAware true");
  }

  if (this->IsSet("CPACK_NSIS_BRANDING_TEXT")) {
    // Default position to LEFT
    std::string brandingTextPosition = "LEFT";
    if (this->IsSet("CPACK_NSIS_BRANDING_TEXT_TRIM_POSITION")) {
      std::string wantedPosition =
        this->GetOption("CPACK_NSIS_BRANDING_TEXT_TRIM_POSITION");
      if (!wantedPosition.empty()) {
        const std::set<std::string> possiblePositions{ "CENTER", "LEFT",
                                                       "RIGHT" };
        if (possiblePositions.find(wantedPosition) ==
            possiblePositions.end()) {
          cmCPackLogger(cmCPackLog::LOG_ERROR,
                        "Unsupported branding text trim position "
                          << wantedPosition << std::endl);
          return false;
        }
        brandingTextPosition = wantedPosition;
      }
    }
    std::string brandingTextCode =
      cmStrCat("BrandingText /TRIM", brandingTextPosition, " \"",
               this->GetOption("CPACK_NSIS_BRANDING_TEXT"), "\"\n");
    this->SetOptionIfNotSet("CPACK_NSIS_BRANDING_TEXT_CODE", brandingTextCode);
  }

  if (!this->IsSet("CPACK_NSIS_IGNORE_LICENSE_PAGE")) {
    std::string licenceCode =
      cmStrCat("!insertmacro MUI_PAGE_LICENSE \"",
               this->GetOption("CPACK_RESOURCE_FILE_LICENSE"), "\"\n");
    this->SetOptionIfNotSet("CPACK_NSIS_LICENSE_PAGE", licenceCode);
  }

  std::string nsisPreArguments;
  if (cmValue nsisArguments =
        this->GetOption("CPACK_NSIS_EXECUTABLE_PRE_ARGUMENTS")) {
    cmList expandedArguments{ nsisArguments };

    for (auto& arg : expandedArguments) {
      if (!cmHasPrefix(arg, NSIS_OPT)) {
        nsisPreArguments = cmStrCat(nsisPreArguments, NSIS_OPT);
      }
      nsisPreArguments = cmStrCat(nsisPreArguments, arg, ' ');
    }
  }

  std::string nsisPostArguments;
  if (cmValue nsisArguments =
        this->GetOption("CPACK_NSIS_EXECUTABLE_POST_ARGUMENTS")) {
    cmList expandedArguments{ nsisArguments };
    for (auto& arg : expandedArguments) {
      if (!cmHasPrefix(arg, NSIS_OPT)) {
        nsisPostArguments = cmStrCat(nsisPostArguments, NSIS_OPT);
      }
      nsisPostArguments = cmStrCat(nsisPostArguments, arg, ' ');
    }
  }

  // Setup all of the component sections
  if (this->Components.empty()) {
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLATION_TYPES", "");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC", "");
    this->SetOptionIfNotSet("CPACK_NSIS_PAGE_COMPONENTS", "");
    this->SetOptionIfNotSet("CPACK_NSIS_FULL_INSTALL",
                            R"(File /r "${INST_DIR}\*.*")");
    this->SetOptionIfNotSet("CPACK_NSIS_COMPONENT_SECTIONS", "");
    this->SetOptionIfNotSet("CPACK_NSIS_COMPONENT_SECTION_LIST", "");
    this->SetOptionIfNotSet("CPACK_NSIS_SECTION_SELECTED_VARS", "");
  } else {
    std::string componentCode;
    std::string sectionList;
    std::string selectedVarsList;
    std::string componentDescriptions;
    std::string groupDescriptions;
    std::string installTypesCode;
    std::string defines;
    std::ostringstream macrosOut;
    bool anyDownloadedComponents = false;

    // Create installation types. The order is significant, so we first fill
    // in a vector based on the indices, and print them in that order.
    std::vector<cmCPackInstallationType*> installTypes(
      this->InstallationTypes.size());
    for (auto& installType : this->InstallationTypes) {
      installTypes[installType.second.Index - 1] = &installType.second;
    }
    for (cmCPackInstallationType* installType : installTypes) {
      installTypesCode += "InstType \"";
      installTypesCode += installType->DisplayName;
      installTypesCode += "\"\n";
    }

    // Create installation groups first
    for (auto& group : this->ComponentGroups) {
      if (group.second.ParentGroup == nullptr) {
        componentCode +=
          this->CreateComponentGroupDescription(&group.second, macrosOut);
      }

      // Add the group description, if any.
      if (!group.second.Description.empty()) {
        groupDescriptions += "  !insertmacro MUI_DESCRIPTION_TEXT ${" +
          group.first + "} \"" +
          cmCPackNSISGenerator::TranslateNewlines(group.second.Description) +
          "\"\n";
      }
    }

    // Create the remaining components, which aren't associated with groups.
    for (auto& comp : this->Components) {
      if (comp.second.Files.empty()) {
        // NSIS cannot cope with components that have no files.
        continue;
      }

      anyDownloadedComponents =
        anyDownloadedComponents || comp.second.IsDownloaded;

      if (!comp.second.Group) {
        componentCode +=
          this->CreateComponentDescription(&comp.second, macrosOut);
      }

      // Add this component to the various section lists.
      sectionList += R"(  !insertmacro "${MacroName}" ")";
      sectionList += comp.first;
      sectionList += "\"\n";
      selectedVarsList += "Var " + comp.first + "_selected\n";
      selectedVarsList += "Var " + comp.first + "_was_installed\n";

      // Add the component description, if any.
      if (!comp.second.Description.empty()) {
        componentDescriptions += "  !insertmacro MUI_DESCRIPTION_TEXT ${" +
          comp.first + "} \"" +
          cmCPackNSISGenerator::TranslateNewlines(comp.second.Description) +
          "\"\n";
      }
    }

    componentCode += macrosOut.str();

    if (componentDescriptions.empty() && groupDescriptions.empty()) {
      // Turn off the "Description" box
      this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC",
                              "!define MUI_COMPONENTSPAGE_NODESC");
    } else {
      componentDescriptions = "!insertmacro MUI_FUNCTION_DESCRIPTION_BEGIN\n" +
        componentDescriptions + groupDescriptions +
        "!insertmacro MUI_FUNCTION_DESCRIPTION_END\n";
      this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC",
                              componentDescriptions);
    }

    if (anyDownloadedComponents) {
      defines += "!define CPACK_USES_DOWNLOAD\n";
      if (this->GetOption("CPACK_ADD_REMOVE").IsOn()) {
        defines += "!define CPACK_NSIS_ADD_REMOVE\n";
      }
    }

    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLATION_TYPES", installTypesCode);
    this->SetOptionIfNotSet("CPACK_NSIS_PAGE_COMPONENTS",
                            "!insertmacro MUI_PAGE_COMPONENTS");
    this->SetOptionIfNotSet("CPACK_NSIS_FULL_INSTALL", "");
    this->SetOptionIfNotSet("CPACK_NSIS_COMPONENT_SECTIONS", componentCode);
    this->SetOptionIfNotSet("CPACK_NSIS_COMPONENT_SECTION_LIST", sectionList);
    this->SetOptionIfNotSet("CPACK_NSIS_SECTION_SELECTED_VARS",
                            selectedVarsList);
    this->SetOption("CPACK_NSIS_DEFINES", defines);
  }

  this->ConfigureFile(nsisInInstallOptions, nsisInstallOptions);
  this->ConfigureFile(nsisInFileName, nsisFileName);
  std::string nsisCmd =
    cmStrCat('"', this->GetOption("CPACK_INSTALLER_PROGRAM"), "\" ",
             nsisPreArguments, " \"", nsisFileName, '"');
  if (!nsisPostArguments.empty()) {
    nsisCmd = cmStrCat(nsisCmd, " ", nsisPostArguments);
  }
  cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Execute: " << nsisCmd << std::endl);
  std::string output;
  int retVal = 1;
  bool res = cmSystemTools::RunSingleCommand(
    nsisCmd, &output, &output, &retVal, nullptr, this->GeneratorVerbose,
    cmDuration::zero());
  if (!res || retVal) {
    cmGeneratedFileStream ofs(tmpFile);
    ofs << "# Run command: " << nsisCmd << std::endl
        << "# Output:" << std::endl
        << output << std::endl;
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Problem running NSIS command: " << nsisCmd << std::endl
                                                   << "Please check "
                                                   << tmpFile << " for errors"
                                                   << std::endl);
    return 0;
  }
  return 1;
}